

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

int __thiscall options::value<int>(options *this,char *s)

{
  mapped_type *pmVar1;
  int v;
  unique_lock<std::mutex> lock;
  istringstream ss;
  allocator<char> local_1c9;
  key_type local_1c8;
  unique_lock<std::mutex> local_1a8;
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  local_1a8._M_owns = false;
  local_1a8._M_device = &this->m;
  std::unique_lock<std::mutex>::lock(&local_1a8);
  local_1a8._M_owns = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,s,&local_1c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->opts,&local_1c8);
  std::__cxx11::istringstream::istringstream(local_198,(string *)pmVar1,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1c8._M_dataplus._M_p._4_4_,(int)local_1c8._M_dataplus._M_p) !=
      &local_1c8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1c8._M_dataplus._M_p._4_4_,(int)local_1c8._M_dataplus._M_p),
                    local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::istream::operator>>((istream *)local_198,(int *)&local_1c8);
  std::__cxx11::istringstream::~istringstream(local_198);
  std::ios_base::~ios_base(local_120);
  std::unique_lock<std::mutex>::~unique_lock(&local_1a8);
  return (int)local_1c8._M_dataplus._M_p;
}

Assistant:

inline T value(const char* s) {
		std::unique_lock<std::mutex> lock(m);
		std::istringstream ss{ opts[std::string{s}] };
		T v;
		ss >> v;
		return v;
	}